

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O2

CTPNStm * __thiscall
CTcParser::parse_stm
          (CTcParser *this,int *err,CTPNStmSwitch *enclosing_switch,int compound_use_enclosing_scope
          )

{
  CTPNStmEnclosing *pCVar1;
  tc_toktyp_t tVar2;
  int iVar3;
  CTPNStmComp *pCVar4;
  CTcToken *pCVar5;
  CTcSymLabel *lbl;
  CTPNStmLabel *this_00;
  CTPNStm *pCVar6;
  CTcPrsNode *expr;
  CTPNStmExpr *this_01;
  CTcToken *siz;
  size_t siz_00;
  CTcTokenizer *this_02;
  CTcToken tok;
  
  this_02 = G_tok;
  siz = &tok;
  this->cur_desc_ = G_tok->last_desc_;
  this->cur_linenum_ = this_02->last_linenum_;
LAB_00233c15:
  tVar2 = (this_02->curtok_).typ_;
  switch(tVar2) {
  case TOKT_DSTR_MID:
  case TOKT_DSTR_END:
  case TOKT_RBRACE:
    CTcTokenizer::log_error_curtok(this_02,0x2b9f);
    this_02 = G_tok;
LAB_00233cb7:
    CTcTokenizer::next(this_02);
LAB_00233f9a:
    this_01 = (CTPNStmExpr *)0x0;
    break;
  case TOKT_RESTR:
  case TOKT_LPAR:
  case TOKT_COMMA:
  case TOKT_DOT:
    goto switchD_00233c2a_caseD_12;
  case TOKT_RPAR:
    goto switchD_00233c2a_caseD_14;
  case TOKT_LBRACE:
    pCVar4 = parse_compound(this,err,1,1,(CTPNStmSwitch *)0x0,compound_use_enclosing_scope);
    return (CTPNStm *)pCVar4;
  default:
    switch(tVar2) {
    case TOKT_IF:
      pCVar6 = parse_if(this,err);
      return pCVar6;
    case TOKT_ELSE:
      iVar3 = 0x2b24;
      goto LAB_00233d47;
    case TOKT_FOR:
      pCVar6 = parse_for(this,err);
      return pCVar6;
    case TOKT_WHILE:
      pCVar6 = parse_while(this,err);
      return pCVar6;
    case TOKT_DO:
      pCVar6 = parse_do_while(this,err);
      return pCVar6;
    case TOKT_SWITCH:
      pCVar6 = parse_switch(this,err);
      return pCVar6;
    case TOKT_CASE:
      if (enclosing_switch != (CTPNStmSwitch *)0x0) {
        pCVar6 = parse_case(this,err,enclosing_switch);
        return pCVar6;
      }
      CTcTokenizer::log_error(0x2b25);
      CTcTokenizer::next(G_tok);
      parse_expr(this);
      tVar2 = (G_tok->curtok_).typ_;
      goto joined_r0x0023401a;
    case TOKT_DEFAULT:
      if (enclosing_switch != (CTPNStmSwitch *)0x0) {
        pCVar6 = parse_default(this,err,enclosing_switch);
        return pCVar6;
      }
      CTcTokenizer::log_error(0x2b26);
      tVar2 = CTcTokenizer::next(G_tok);
joined_r0x0023401a:
      this_02 = G_tok;
      if (tVar2 != TOKT_COLON) {
        return (CTPNStm *)0x0;
      }
      goto LAB_00233cb7;
    case TOKT_GOTO:
      pCVar6 = parse_goto((CTcParser *)this_02,err);
      return pCVar6;
    case TOKT_BREAK:
      pCVar6 = parse_break((CTcParser *)this_02,err);
      return pCVar6;
    case TOKT_CONTINUE:
      pCVar6 = parse_continue((CTcParser *)this_02,err);
      return pCVar6;
    case TOKT_FUNCTION:
    case TOKT_OBJECT:
    case TOKT_NIL:
    case TOKT_TRUE:
    case TOKT_PASS:
    case TOKT_EXTERNAL:
    case TOKT_EXTERN:
    case TOKT_FORMATSTRING:
    case TOKT_CLASS:
    case TOKT_REPLACE:
    case TOKT_MODIFY:
    case TOKT_NEW:
    case TOKT_DELETE:
    case TOKT_INTRINSIC:
    case TOKT_DICTIONARY:
    case TOKT_GRAMMAR:
    case TOKT_ENUM:
    case TOKT_TEMPLATE:
    case TOKT_STATIC:
      goto switchD_00233c2a_caseD_12;
    case TOKT_RETURN:
      pCVar6 = parse_return(this,err);
      return pCVar6;
    case TOKT_LOCAL:
      create_scope_local_symtab(this);
      pCVar6 = parse_local(this,err);
      return pCVar6;
    case TOKT_THROW:
      pCVar6 = parse_throw(this,err);
      return pCVar6;
    case TOKT_TRY:
      pCVar6 = parse_try(this,err);
      return pCVar6;
    case TOKT_CATCH:
      CTcTokenizer::log_error(0x2b43);
      tVar2 = CTcTokenizer::next(G_tok);
      if (tVar2 != TOKT_LPAR) {
        return (CTPNStm *)0x0;
      }
      tVar2 = CTcTokenizer::next(G_tok);
      if (((tVar2 != TOKT_SYM) || (tVar2 = CTcTokenizer::next(G_tok), tVar2 != TOKT_SYM)) ||
         (tVar2 = CTcTokenizer::next(G_tok), this_02 = G_tok, tVar2 != TOKT_RPAR))
      goto LAB_00233f9a;
      goto LAB_00233cb7;
    case TOKT_FINALLY:
      iVar3 = 0x2b44;
LAB_00233d47:
      CTcTokenizer::log_error(iVar3);
      CTcTokenizer::next(G_tok);
      return (CTPNStm *)0x0;
    case TOKT_FOREACH:
      pCVar6 = parse_foreach(this,err);
      return pCVar6;
    }
    if (tVar2 == TOKT_SEM) goto LAB_00233cb7;
    if (tVar2 == TOKT_SYM) {
      pCVar5 = CTcTokenizer::copycur(this_02);
      tok.typ_ = pCVar5->typ_;
      tok._4_4_ = *(undefined4 *)&pCVar5->field_0x4;
      tok.text_ = pCVar5->text_;
      tok.text_len_ = pCVar5->text_len_;
      tok.int_val_ = pCVar5->int_val_;
      tok._32_1_ = pCVar5->field_0x20;
      tVar2 = CTcTokenizer::next(G_tok);
      if (tVar2 == TOKT_COLON) {
        lbl = add_code_label(this,&tok);
        this_00 = (CTPNStmLabel *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x50,(size_t)siz);
        CTPNStmLabel::CTPNStmLabel(this_00,lbl,this->enclosing_stm_);
        CTcTokenizer::next(G_tok);
        pCVar1 = this->enclosing_stm_;
        this->enclosing_stm_ = (CTPNStmEnclosing *)this_00;
        pCVar6 = parse_stm(this,err,enclosing_switch,0);
        this->enclosing_stm_ = pCVar1;
        if (*err == 0) {
          (this_00->super_CTPNStmLabelBase).stm_ = pCVar6;
          if (lbl == (CTcSymLabel *)0x0) {
            return (CTPNStm *)this_00;
          }
          (lbl->super_CTcSymLabelBase).stm_ = this_00;
          return (CTPNStm *)this_00;
        }
        goto LAB_00233f9a;
      }
      CTcTokenizer::unget(G_tok);
    }
    else if (tVar2 == TOKT_EOF) {
      CTcTokenizer::log_error(0x2b22);
      *err = 1;
      return (CTPNStm *)0x0;
    }
switchD_00233c2a_caseD_12:
    siz_00 = 1;
    expr = parse_expr_or_dstr(this,1);
    iVar3 = parse_req_sem();
    if (iVar3 != 0) {
      *err = 1;
      goto LAB_00233f9a;
    }
    if (expr == (CTcPrsNode *)0x0) goto LAB_00233f9a;
    this_01 = (CTPNStmExpr *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x28,siz_00);
    CTPNStmExpr::CTPNStmExpr(this_01,expr);
  }
  return (CTPNStm *)this_01;
switchD_00233c2a_caseD_14:
  CTcTokenizer::log_error(0x2b13);
  CTcTokenizer::next(G_tok);
  this_02 = G_tok;
  goto LAB_00233c15;
}

Assistant:

CTPNStm *CTcParser::parse_stm(int *err, CTPNStmSwitch *enclosing_switch,
                              int compound_use_enclosing_scope)
{
    CTcToken tok;

    /* 
     *   remember where the statement starts - when we create the
     *   statement object, it will refer to these values to set its
     *   internal memory of the statement's source file location 
     */
    cur_desc_ = G_tok->get_last_desc();
    cur_linenum_ = G_tok->get_last_linenum();

    /* see what we have */
try_again:
    switch(G_tok->cur())
    {
    case TOKT_EOF:
        /* unexpected end of file - log an error */
        G_tok->log_error(TCERR_EOF_IN_CODE);
        
        /* set the caller's error flag */
        *err = TRUE;

        /* there's no statement to return, obviously */
        return 0;

    case TOKT_DSTR_MID:
    case TOKT_DSTR_END:
    case TOKT_RBRACE:
        /* 
         *   we shouldn't be looking at any of these at the start of a
         *   statement 
         */
        G_tok->log_error_curtok(TCERR_EXPECTED_STMT_START);
        G_tok->next();
        return 0;

    case TOKT_SEM:
        /* 
         *   null statement - this doesn't generate any code; simply skip
         *   the semicolon and keep going 
         */
        G_tok->next();

        /* this doesn't generate any code */
        return 0;

    case TOKT_LOCAL:
        /* if we don't have our own local symbol table, create one */
        create_scope_local_symtab();

        /* parse the local variable definition and return the result */
        return parse_local(err);

    case TOKT_LBRACE:
        /* it's a compound statement */
        return parse_compound(err, TRUE, TRUE,
                              0, compound_use_enclosing_scope);
        
    case TOKT_IF:
        /* parse an if statement */
        return parse_if(err);

    case TOKT_RETURN:
        /* parse a return statement */
        return parse_return(err);

    case TOKT_FOR:
        /* parse a for statement */
        return parse_for(err);

    case TOKT_FOREACH:
        /* parse a foreach statement */
        return parse_foreach(err);

    case TOKT_WHILE:
        /* parse a while statement */
        return parse_while(err);

    case TOKT_DO:
        /* parse a do-while */
        return parse_do_while(err);

    case TOKT_SWITCH:
        /* parse a switch */
        return parse_switch(err);

    case TOKT_GOTO:
        /* parse a 'goto' */
        return parse_goto(err);

    case TOKT_BREAK:
        return parse_break(err);

    case TOKT_CONTINUE:
        return parse_continue(err);

    case TOKT_TRY:
        return parse_try(err);

    case TOKT_THROW:
        return parse_throw(err);

    case TOKT_CATCH:
        /* misplaced 'catch' clause - log an error */
        G_tok->log_error(TCERR_MISPLACED_CATCH);

        /* 
         *   skip the following open paren, class name, variable name, and
         *   closing paren, as long as we find all of these 
         */
        if (G_tok->next() == TOKT_LPAR
            && G_tok->next() == TOKT_SYM
            && G_tok->next() == TOKT_SYM
            && G_tok->next() == TOKT_RPAR)
            G_tok->next();

        /* there's no valid statement to return */
        return 0;

    case TOKT_FINALLY:
        /* misplaced 'finally' clause - log an error */
        G_tok->log_error(TCERR_MISPLACED_FINALLY);

        /* skip the 'finally' keyword, and return failure */
        G_tok->next();
        return 0;

    case TOKT_ELSE:
        /* 
         *   misplaced 'else' clause - log an error, skip the 'else'
         *   keyword, and proceed with what follows 
         */
        G_tok->log_error(TCERR_MISPLACED_ELSE);
        G_tok->next();
        return 0;

    case TOKT_CASE:
        /* 
         *   if we're in a 'switch', it's a valid 'case' label; otherwise,
         *   it's misplaced 
         */
        if (enclosing_switch != 0)
        {
            /* parse the 'case' label */
            return parse_case(err, enclosing_switch);
        }
        else
        {
            /* 
             *   not directly within a 'switch', so this is a misplaced
             *   'case' keyword - log an error 
             */
            G_tok->log_error(TCERR_MISPLACED_CASE);
            
            /* skip the 'case' keyword */
            G_tok->next();
            
            /* assume there's an expression here, and skip that as well */
            parse_expr();
            
            /* if there's a colon, skip it, too */
            if (G_tok->cur() == TOKT_COLON)
                G_tok->next();
            
            /* proceed from here */
            return 0;
        }

    case TOKT_DEFAULT:
        /* allow this only if we're directly in a 'switch' body */
        if (enclosing_switch != 0)
        {
            /* parse the 'default' label */
            return parse_default(err, enclosing_switch);
        }
        else
        {
            /* misplaced 'default' keyword - log an error */
            G_tok->log_error(TCERR_MISPLACED_DEFAULT);
            
            /* skip the 'default' keyword; if there's a colon, skip it, too */
            if (G_tok->next() == TOKT_COLON)
                G_tok->next();

            /* proceed from here */
            return 0;
        }

    case TOKT_SYM:
        /*
         *   It's a symbol.  First, check for a label.  This requires that
         *   we look ahead one token, because we have to look at the next
         *   token to see if it's a colon; if it's not, we have to back up
         *   and parse the symbol as the start of an expression.  So,
         *   remember the current symbol token, then look at what follows.
         */
        tok = *G_tok->copycur();
        if (G_tok->next() == TOKT_COLON)
        {
            CTPNStmEnclosing *old_enclosing;
            CTPNStmLabel *label_stm;
            CTcSymLabel *lbl;
            CTPNStm *stm;

            /* it's a label - create a symbol table entry for it */
            lbl = add_code_label(&tok);

            /* create the labeled statement node */
            label_stm = new CTPNStmLabel(lbl, enclosing_stm_);

            /* skip the colon */
            G_tok->next();

            /* 
             *   set our new label to be the enclosing label for
             *   everything contained within its statement 
             */
            old_enclosing = set_enclosing_stm(label_stm);

            /* parse the labeled statement */
            stm = parse_stm(err, enclosing_switch, FALSE);

            /* restore our enclosing statement */
            set_enclosing_stm(old_enclosing);

            /* if parsing the labeled statement failed, give up */
            if (*err)
                return 0;

            /* connect to the label to the statement it labels */
            label_stm->set_stm(stm);

            /* point the label symbol to its statement node */
            if (lbl != 0)
                lbl->set_stm(label_stm);

            /* return the labeled statement node */
            return label_stm;
        }

        /* 
         *   it's not a label - push the colon back into the input stream
         *   so that we read it again, then parse this as an ordinary
         *   expression 
         */
        G_tok->unget();
        goto do_parse_expr;

    case TOKT_RPAR:
        /* 
         *   they probably had too many close parens in something like a
         *   'for' or 'if' statement - flag the error 
         */
        G_tok->log_error(TCERR_EXTRA_RPAR);

        /* skip the extra paren and go back for another try */
        G_tok->next();
        goto try_again;
        
    default:
    do_parse_expr:
        /* anything else must be the start of an expression */
        {
            /* parse the expression */
            CTcPrsNode *expr = parse_expr_or_dstr(TRUE);

            /* the statement must be terminated with a semicolon */
            if (parse_req_sem())
            {
                /* set the error flag */
                *err = TRUE;

                /* there's no statement to return */
                return 0;
            }
            
            /* 
             *   if we successfully parsed an expression, create a
             *   statement node for the expression; if expr is null, the
             *   expression parser will already have issued an error, so
             *   we can simply ignore the failed expression and continue
             *   to the next statement 
             */
            if (expr != 0)
                return new CTPNStmExpr(expr);
            else
                return 0;
        }
    }
}